

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# push_sinc_resampler.cc
# Opt level: O0

void __thiscall
webrtc::PushSincResampler::Run(PushSincResampler *this,size_t frames,float *destination)

{
  float *local_1b8;
  size_t i;
  FatalMessage local_1a0;
  string *local_28;
  string *_result;
  float *destination_local;
  size_t frames_local;
  PushSincResampler *this_local;
  
  _result = (string *)destination;
  destination_local = (float *)frames;
  frames_local = (size_t)this;
  local_28 = rtc::CheckEQImpl<unsigned_long,unsigned_long>
                       (&this->source_available_,(unsigned_long *)&destination_local,
                        "source_available_ == frames");
  if (local_28 == (string *)0x0) {
    if ((this->first_pass_ & 1U) == 0) {
      if (this->source_ptr_ == (float *)0x0) {
        for (local_1b8 = (float *)0x0; local_1b8 < destination_local;
            local_1b8 = (float *)((long)local_1b8 + 1)) {
          *(float *)(_result + (long)local_1b8 * 4) =
               (float)(int)this->source_ptr_int_[(long)local_1b8];
        }
      }
      else {
        memcpy(_result,this->source_ptr_,(long)destination_local << 2);
      }
      this->source_available_ = this->source_available_ - (long)destination_local;
    }
    else {
      memset(_result,0,(long)destination_local << 2);
      this->first_pass_ = false;
    }
    return;
  }
  rtc::FatalMessage::FatalMessage
            (&local_1a0,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/resampler/push_sinc_resampler.cc"
             ,0x54,local_28);
  rtc::FatalMessage::stream(&local_1a0);
  rtc::FatalMessage::~FatalMessage(&local_1a0);
}

Assistant:

void PushSincResampler::Run(size_t frames, float* destination) {
  // Ensure we are only asked for the available samples. This would fail if
  // Run() was triggered more than once per Resample() call.
  RTC_CHECK_EQ(source_available_, frames);

  if (first_pass_) {
    // Provide dummy input on the first pass, the output of which will be
    // discarded, as described in Resample().
    std::memset(destination, 0, frames * sizeof(*destination));
    first_pass_ = false;
    return;
  }

  if (source_ptr_) {
    std::memcpy(destination, source_ptr_, frames * sizeof(*destination));
  } else {
    for (size_t i = 0; i < frames; ++i)
      destination[i] = static_cast<float>(source_ptr_int_[i]);
  }
  source_available_ -= frames;
}